

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_EnvelopeSSGEG(ym3438_t *chip)

{
  uint uVar1;
  byte local_15;
  Bit8u direction;
  Bit32u slot;
  ym3438_t *chip_local;
  
  uVar1 = chip->cycles;
  local_15 = 0;
  chip->eg_ssg_pgrst_latch[uVar1] = '\0';
  chip->eg_ssg_repeat_latch[uVar1] = '\0';
  chip->eg_ssg_hold_up_latch[uVar1] = '\0';
  chip->eg_ssg_inv[uVar1] = '\0';
  if ((chip->ssg_eg[uVar1] & 8) != 0) {
    local_15 = chip->eg_ssg_dir[uVar1];
    if ((chip->eg_level[uVar1] & 0x200) != 0) {
      if ((chip->ssg_eg[uVar1] & 3) == 0) {
        chip->eg_ssg_pgrst_latch[uVar1] = '\x01';
      }
      if ((chip->ssg_eg[uVar1] & 1) == 0) {
        chip->eg_ssg_repeat_latch[uVar1] = '\x01';
      }
      if ((chip->ssg_eg[uVar1] & 3) == 2) {
        local_15 = local_15 ^ 1;
      }
      if ((chip->ssg_eg[uVar1] & 3) == 3) {
        local_15 = 1;
      }
    }
    if ((chip->eg_kon_latch[uVar1] != '\0') &&
       (((chip->ssg_eg[uVar1] & 7) == 5 || ((chip->ssg_eg[uVar1] & 7) == 3)))) {
      chip->eg_ssg_hold_up_latch[uVar1] = '\x01';
    }
    local_15 = local_15 & chip->eg_kon[uVar1];
    chip->eg_ssg_inv[uVar1] =
         (chip->eg_ssg_dir[uVar1] ^ (byte)((int)(uint)chip->ssg_eg[uVar1] >> 2) & 1) &
         chip->eg_kon[uVar1];
  }
  chip->eg_ssg_dir[uVar1] = local_15;
  chip->eg_ssg_enable[uVar1] = (byte)((int)(uint)chip->ssg_eg[uVar1] >> 3) & 1;
  return;
}

Assistant:

void OPN2_EnvelopeSSGEG(ym3438_t *chip)
{
    Bit32u slot = chip->cycles;
    Bit8u direction = 0;
    chip->eg_ssg_pgrst_latch[slot] = 0;
    chip->eg_ssg_repeat_latch[slot] = 0;
    chip->eg_ssg_hold_up_latch[slot] = 0;
    chip->eg_ssg_inv[slot] = 0;
    if (chip->ssg_eg[slot] & 0x08)
    {
        direction = chip->eg_ssg_dir[slot];
        if (chip->eg_level[slot] & 0x200)
        {
            /* Reset */
            if ((chip->ssg_eg[slot] & 0x03) == 0x00)
            {
                chip->eg_ssg_pgrst_latch[slot] = 1;
            }
            /* Repeat */
            if ((chip->ssg_eg[slot] & 0x01) == 0x00)
            {
                chip->eg_ssg_repeat_latch[slot] = 1;
            }
            /* Inverse */
            if ((chip->ssg_eg[slot] & 0x03) == 0x02)
            {
                direction ^= 1;
            }
            if ((chip->ssg_eg[slot] & 0x03) == 0x03)
            {
                direction = 1;
            }
        }
        /* Hold up */
        if (chip->eg_kon_latch[slot]
         && ((chip->ssg_eg[slot] & 0x07) == 0x05 || (chip->ssg_eg[slot] & 0x07) == 0x03))
        {
            chip->eg_ssg_hold_up_latch[slot] = 1;
        }
        direction &= chip->eg_kon[slot];
        chip->eg_ssg_inv[slot] = (chip->eg_ssg_dir[slot] ^ ((chip->ssg_eg[slot] >> 2) & 0x01))
                               & chip->eg_kon[slot];
    }
    chip->eg_ssg_dir[slot] = direction;
    chip->eg_ssg_enable[slot] = (chip->ssg_eg[slot] >> 3) & 0x01;
}